

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O3

void __thiscall
cmInstallTargetGeneratorLocal::cmInstallTargetGeneratorLocal
          (cmInstallTargetGeneratorLocal *this,cmLocalGenerator *lg,string *t,char *dest,bool implib
          )

{
  MessageLevel message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_48;
  
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  message = cmInstallGenerator::SelectMessageLevel(lg->Makefile,false);
  cmInstallTargetGenerator::cmInstallTargetGenerator
            (&this->super_cmInstallTargetGenerator,t,dest,implib,"",&local_48,"Unspecified",message,
             false);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_48);
  (this->super_cmInstallTargetGenerator).super_cmInstallGenerator.super_cmScriptGenerator.
  _vptr_cmScriptGenerator = (_func_int **)&PTR__cmInstallTargetGenerator_005c5750;
  cmInstallTargetGenerator::Compute(&this->super_cmInstallTargetGenerator,lg);
  return;
}

Assistant:

cmInstallTargetGeneratorLocal(cmLocalGenerator* lg, std::string const& t,
                                const char* dest, bool implib):
    cmInstallTargetGenerator(
      t, dest, implib, "", std::vector<std::string>(), "Unspecified",
      cmInstallGenerator::SelectMessageLevel(lg->GetMakefile()),
      false)
  {
    this->Compute(lg);
  }